

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPhotonProduction.hpp
# Opt level: O2

PhotonProduction * __thiscall
njoy::ENDFtk::section::Type<12>::
readPhotonProduction<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (PhotonProduction *__return_storage_ptr__,Type<12> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LO,int N)

{
  undefined8 *puVar1;
  char *in_stack_ffffffffffffff28;
  undefined1 local_d0 [176];
  
  if (MT == 2) {
    TransitionProbabilities::
    TransitionProbabilities<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TransitionProbabilities *)local_d0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    ::
    variant<njoy::ENDFtk::section::Type<12>::TransitionProbabilities,void,void,njoy::ENDFtk::section::Type<12>::TransitionProbabilities,void>
              ((variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                *)__return_storage_ptr__,(TransitionProbabilities *)local_d0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)(local_d0 + 0x30));
  }
  else {
    if (MT != 1) {
      tools::Log::error<char_const*>(in_stack_ffffffffffffff28);
      tools::Log::info<char_const*>(in_stack_ffffffffffffff28);
      tools::Log::info<char_const*,int>("LO value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",(long)end->_M_current);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    Multiplicities::Multiplicities<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((Multiplicities *)local_d0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF,LO);
    std::
    variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
    ::
    variant<njoy::ENDFtk::section::Type<12>::Multiplicities,void,void,njoy::ENDFtk::section::Type<12>::Multiplicities,void>
              ((variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                *)__return_storage_ptr__,(Multiplicities *)local_d0);
    Multiplicities::~Multiplicities((Multiplicities *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

static PhotonProduction
readPhotonProduction( Iterator& begin,
                      const Iterator& end,
                      long& lineNumber,
                      int MAT,
                      int MF,
                      int MT,
                      int LO,
                      int N ) {

  switch ( LO ) {
    case 1: return Multiplicities( begin, end, lineNumber, MAT, MF, MT, N );
    case 2: return TransitionProbabilities( begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LO value" );
      Log::info( "LO is either 1 (multiplicities) or 2 (probabilities)" );
      Log::info( "LO value: {}", LO );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}